

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O0

int mbedtls_rsa_copy(mbedtls_rsa_context *dst,mbedtls_rsa_context *src)

{
  int local_1c;
  int ret;
  mbedtls_rsa_context *src_local;
  mbedtls_rsa_context *dst_local;
  
  dst->ver = src->ver;
  dst->len = src->len;
  local_1c = mbedtls_mpi_copy(&dst->N,&src->N);
  if (((((local_1c == 0) && (local_1c = mbedtls_mpi_copy(&dst->E,&src->E), local_1c == 0)) &&
       (local_1c = mbedtls_mpi_copy(&dst->D,&src->D), local_1c == 0)) &&
      (((local_1c = mbedtls_mpi_copy(&dst->P,&src->P), local_1c == 0 &&
        (local_1c = mbedtls_mpi_copy(&dst->Q,&src->Q), local_1c == 0)) &&
       ((local_1c = mbedtls_mpi_copy(&dst->DP,&src->DP), local_1c == 0 &&
        ((local_1c = mbedtls_mpi_copy(&dst->DQ,&src->DQ), local_1c == 0 &&
         (local_1c = mbedtls_mpi_copy(&dst->QP,&src->QP), local_1c == 0)))))))) &&
     ((local_1c = mbedtls_mpi_copy(&dst->RN,&src->RN), local_1c == 0 &&
      ((((local_1c = mbedtls_mpi_copy(&dst->RP,&src->RP), local_1c == 0 &&
         (local_1c = mbedtls_mpi_copy(&dst->RQ,&src->RQ), local_1c == 0)) &&
        (local_1c = mbedtls_mpi_copy(&dst->Vi,&src->Vi), local_1c == 0)) &&
       (local_1c = mbedtls_mpi_copy(&dst->Vf,&src->Vf), local_1c == 0)))))) {
    dst->padding = src->padding;
    dst->hash_id = src->hash_id;
  }
  if (local_1c != 0) {
    mbedtls_rsa_free(dst);
  }
  return local_1c;
}

Assistant:

int mbedtls_rsa_copy( mbedtls_rsa_context *dst, const mbedtls_rsa_context *src )
{
    int ret;

    dst->ver = src->ver;
    dst->len = src->len;

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->N, &src->N ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->E, &src->E ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->D, &src->D ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->P, &src->P ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->Q, &src->Q ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->DP, &src->DP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->DQ, &src->DQ ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->QP, &src->QP ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->RN, &src->RN ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->RP, &src->RP ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->RQ, &src->RQ ) );

    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->Vi, &src->Vi ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &dst->Vf, &src->Vf ) );

    dst->padding = src->padding;
    dst->hash_id = src->hash_id;

cleanup:
    if( ret != 0 )
        mbedtls_rsa_free( dst );

    return( ret );
}